

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cpp
# Opt level: O3

int __thiscall
ncnn::Interp::forward
          (Interp *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  float *pfVar1;
  float *pfVar2;
  undefined4 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  uint uVar6;
  uint uVar7;
  Mat *pMVar8;
  Mat *this_00;
  size_t sVar9;
  size_type sVar10;
  size_t sVar11;
  size_t sVar12;
  float fVar13;
  float fVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  uint outw_00;
  uint outw_01;
  int size;
  int iVar18;
  uint uVar19;
  int *piVar20;
  Interp *pIVar21;
  int *piVar22;
  void *pvVar23;
  uint uVar24;
  int iVar25;
  long lVar26;
  ulong uVar27;
  size_t sVar28;
  undefined4 *puVar29;
  void *pvVar30;
  float *pfVar31;
  ulong uVar32;
  void *pvVar33;
  float *rows0p;
  ulong uVar34;
  void *pvVar35;
  void *pvVar36;
  int iVar37;
  int iVar38;
  float *rows1p;
  ulong uVar39;
  long lVar40;
  void *pvVar41;
  Interp *pIVar42;
  void *pvVar43;
  float *rows2p;
  long lVar44;
  void *pvVar45;
  long lVar46;
  long lVar47;
  long lVar48;
  uint uVar49;
  void *pvVar50;
  float fVar51;
  undefined1 auVar52 [16];
  float fVar53;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  int outh;
  int outw;
  uint local_1ac;
  Interp *local_1a8;
  int *local_1a0;
  size_t local_198;
  uint local_18c;
  Interp *local_188;
  Interp *local_180;
  int *local_178;
  float *local_170;
  Mat local_168;
  Mat local_118;
  Mat local_c8;
  Mat local_78;
  
  pMVar8 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  this_00 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  uVar6 = pMVar8->w;
  uVar19 = pMVar8->h;
  uVar27 = (ulong)uVar19;
  uVar49 = pMVar8->c;
  pIVar21 = (Interp *)(ulong)uVar49;
  iVar25 = pMVar8->dims;
  sVar9 = pMVar8->elemsize;
  local_18c = pMVar8[1].w;
  local_1ac = pMVar8[1].h;
  if (((this->size_expr)._M_string_length != 0) &&
     (iVar18 = eval_size_expr(this,bottom_blobs,(int *)&local_18c,(int *)&local_1ac), iVar18 != 0))
  {
    return -1;
  }
  outw_00 = local_18c;
  uVar7 = local_1ac;
  lVar44 = (long)(int)local_18c;
  uVar32 = (ulong)local_18c;
  local_1a8 = this;
  if (iVar25 == 2) {
    if (local_18c == uVar6) goto LAB_00419a0e;
    Mat::create(this_00,local_18c,uVar19,sVar9,opt->blob_allocator);
    pIVar21 = local_1a8;
    pvVar30 = this_00->data;
    if (pvVar30 == (void *)0x0) {
      return -100;
    }
    if ((long)this_00->c * this_00->cstep == 0) {
      return -100;
    }
    iVar25 = local_1a8->resize_type;
    if (iVar25 == 2) {
      uVar39 = 0xffffffffffffffff;
      if (-1 < (int)outw_00) {
        uVar39 = lVar44 * 0xc;
      }
      piVar22 = (int *)operator_new__(uVar39);
      linear_coeffs(uVar6,outw_00,piVar22,(float *)(piVar22 + lVar44),pIVar21->align_corner);
      if (0 < (int)uVar19) {
        pvVar50 = pMVar8->data;
        iVar25 = pMVar8->w;
        sVar9 = pMVar8->elemsize;
        iVar18 = this_00->w;
        sVar28 = this_00->elemsize;
        uVar39 = 0;
        do {
          if (0 < (int)outw_00) {
            uVar34 = 0;
            do {
              uVar5 = *(undefined8 *)(piVar22 + lVar44 + uVar34 * 2);
              uVar4 = *(undefined8 *)
                       ((long)pvVar50 + (long)piVar22[uVar34] * 4 + (long)iVar25 * sVar9 * uVar39);
              *(float *)((long)pvVar30 + uVar34 * 4) =
                   (float)((ulong)uVar4 >> 0x20) * (float)((ulong)uVar5 >> 0x20) +
                   (float)uVar4 * (float)uVar5;
              uVar34 = uVar34 + 1;
            } while (uVar32 != uVar34);
          }
          uVar39 = uVar39 + 1;
          pvVar30 = (void *)((long)pvVar30 + (long)iVar18 * sVar28);
        } while (uVar39 != uVar27);
      }
      operator_delete__(piVar22);
      iVar25 = local_1a8->resize_type;
    }
    else if (iVar25 == 1) {
      if ((local_1a8->output_width == 0) && ((local_1a8->size_expr)._M_string_length == 0)) {
        fVar51 = 1.0 / local_1a8->width_scale;
      }
      else {
        fVar51 = (float)(int)uVar6 / (float)(int)outw_00;
      }
      if ((int)uVar19 < 1) {
        return 0;
      }
      pvVar50 = pMVar8->data;
      iVar25 = pMVar8->w;
      sVar9 = pMVar8->elemsize;
      iVar18 = this_00->w;
      sVar28 = this_00->elemsize;
      uVar32 = 0;
      do {
        if (0 < (int)outw_00) {
          lVar44 = 0;
          do {
            iVar37 = (int)((float)(int)lVar44 * fVar51);
            iVar38 = uVar6 - 1;
            if (iVar37 <= (int)(uVar6 - 1)) {
              iVar38 = iVar37;
            }
            *(undefined4 *)((long)pvVar30 + lVar44 * 4) =
                 *(undefined4 *)((long)pvVar50 + (long)iVar38 * 4 + (long)iVar25 * sVar9 * uVar32);
            lVar44 = lVar44 + 1;
          } while (outw_00 != (uint)lVar44);
        }
        uVar32 = uVar32 + 1;
        pvVar30 = (void *)((long)pvVar30 + (long)iVar18 * sVar28);
      } while (uVar32 != uVar27);
      return 0;
    }
    pIVar21 = local_1a8;
    if (iVar25 != 3) {
      return 0;
    }
    uVar39 = 0xffffffffffffffff;
    if (-1 < (int)outw_00) {
      uVar39 = lVar44 * 0x14;
    }
    piVar22 = (int *)operator_new__(uVar39);
    cubic_coeffs(uVar6,outw_00,piVar22,(float *)(piVar22 + lVar44),pIVar21->align_corner);
    if (0 < (int)uVar19) {
      iVar25 = pMVar8->w;
      sVar9 = pMVar8->elemsize;
      pvVar30 = pMVar8->data;
      iVar18 = this_00->w;
      sVar28 = this_00->elemsize;
      pvVar50 = this_00->data;
      uVar39 = 0;
      do {
        if (0 < (int)outw_00) {
          lVar46 = 0;
          do {
            pfVar2 = (float *)(piVar22 + lVar44 + lVar46);
            pfVar31 = (float *)((long)pvVar30 +
                               (long)*(int *)((long)piVar22 + lVar46) * 4 +
                               (long)iVar25 * sVar9 * uVar39 + -4);
            *(float *)((long)pvVar50 + lVar46) =
                 pfVar31[3] * pfVar2[3] + pfVar31[1] * pfVar2[1] +
                 pfVar31[2] * pfVar2[2] + *pfVar31 * *pfVar2;
            lVar46 = lVar46 + 4;
          } while (uVar32 * 4 - lVar46 != 0);
        }
        uVar39 = uVar39 + 1;
        pvVar50 = (void *)((long)pvVar50 + (long)iVar18 * sVar28);
      } while (uVar39 != uVar27);
    }
  }
  else {
    if (iVar25 == 1) {
      Mat::create(this_00,local_18c,local_1ac,uVar6,sVar9,opt->blob_allocator);
      auVar17 = _DAT_005a4730;
      auVar16 = _DAT_005a4720;
      auVar15 = _DAT_005a40e0;
      if (this_00->data == (void *)0x0) {
        return -100;
      }
      sVar9 = this_00->cstep;
      if ((long)this_00->c * sVar9 != 0) {
        if ((int)uVar6 < 1) {
          return 0;
        }
        lVar44 = (long)this_00->h * (long)this_00->w;
        uVar27 = this_00->elemsize;
        uVar32 = 0;
        pvVar30 = pMVar8->data;
        iVar25 = (int)((uVar27 * lVar44 + 0xf & 0xfffffffffffffff0) / uVar27);
        if (this_00->dims == 4) {
          iVar25 = (int)lVar44;
        }
        uVar19 = iVar25 * this_00->d;
        lVar44 = (ulong)uVar19 - 1;
        auVar52._8_4_ = (int)lVar44;
        auVar52._0_8_ = lVar44;
        auVar52._12_4_ = (int)((ulong)lVar44 >> 0x20);
        lVar44 = (long)this_00->data + 0xc;
        auVar52 = auVar52 ^ _DAT_005a40e0;
        do {
          if (0 < (int)uVar19) {
            uVar3 = *(undefined4 *)((long)pvVar30 + uVar32 * 4);
            uVar39 = 0;
            do {
              auVar54._8_4_ = (int)uVar39;
              auVar54._0_8_ = uVar39;
              auVar54._12_4_ = (int)(uVar39 >> 0x20);
              auVar55 = (auVar54 | auVar17) ^ auVar15;
              iVar25 = auVar52._4_4_;
              if ((bool)(~(iVar25 < auVar55._4_4_ ||
                          auVar52._0_4_ < auVar55._0_4_ && auVar55._4_4_ == iVar25) & 1)) {
                *(undefined4 *)(lVar44 + -0xc + uVar39 * 4) = uVar3;
              }
              if (auVar55._12_4_ <= auVar52._12_4_ &&
                  (auVar55._8_4_ <= auVar52._8_4_ || auVar55._12_4_ != auVar52._12_4_)) {
                *(undefined4 *)(lVar44 + -8 + uVar39 * 4) = uVar3;
              }
              auVar54 = (auVar54 | auVar16) ^ auVar15;
              iVar18 = auVar54._4_4_;
              if (iVar18 <= iVar25 && (iVar18 != iVar25 || auVar54._0_4_ <= auVar52._0_4_)) {
                *(undefined4 *)(lVar44 + -4 + uVar39 * 4) = uVar3;
                *(undefined4 *)(lVar44 + uVar39 * 4) = uVar3;
              }
              uVar39 = uVar39 + 4;
            } while ((uVar19 + 3 & 0xfffffffc) != uVar39);
          }
          uVar32 = uVar32 + 1;
          lVar44 = lVar44 + sVar9 * uVar27;
        } while (uVar32 != uVar6);
        return 0;
      }
      return -100;
    }
    if (local_1ac == uVar19 && local_18c == uVar6) {
LAB_00419a0e:
      if (this_00 != pMVar8) {
        piVar22 = pMVar8->refcount;
        if (piVar22 != (int *)0x0) {
          LOCK();
          *piVar22 = *piVar22 + 1;
          UNLOCK();
        }
        piVar22 = this_00->refcount;
        if (piVar22 != (int *)0x0) {
          LOCK();
          *piVar22 = *piVar22 + -1;
          UNLOCK();
          if (*piVar22 == 0) {
            if (this_00->allocator == (Allocator *)0x0) {
              if (this_00->data != (void *)0x0) {
                free(this_00->data);
              }
            }
            else {
              (*this_00->allocator->_vptr_Allocator[3])();
            }
          }
        }
        this_00->cstep = 0;
        this_00->data = (void *)0x0;
        this_00->refcount = (int *)0x0;
        *(undefined8 *)((long)&this_00->refcount + 4) = 0;
        *(undefined8 *)((long)&this_00->elemsize + 4) = 0;
        this_00->dims = 0;
        this_00->w = 0;
        this_00->h = 0;
        this_00->d = 0;
        this_00->c = 0;
        piVar22 = pMVar8->refcount;
        this_00->data = pMVar8->data;
        this_00->refcount = piVar22;
        this_00->elemsize = pMVar8->elemsize;
        this_00->elempack = pMVar8->elempack;
        this_00->allocator = pMVar8->allocator;
        iVar25 = pMVar8->w;
        iVar18 = pMVar8->h;
        iVar38 = pMVar8->d;
        this_00->dims = pMVar8->dims;
        this_00->w = iVar25;
        this_00->h = iVar18;
        this_00->d = iVar38;
        this_00->c = pMVar8->c;
        this_00->cstep = pMVar8->cstep;
        return 0;
      }
      return 0;
    }
    Mat::create(this_00,local_18c,local_1ac,uVar49,sVar9,opt->blob_allocator);
    outw_01 = local_18c;
    pIVar42 = local_1a8;
    uVar24 = local_1ac;
    pvVar30 = this_00->data;
    if (pvVar30 == (void *)0x0) {
      return -100;
    }
    sVar9 = this_00->cstep;
    if ((long)this_00->c * sVar9 == 0) {
      return -100;
    }
    iVar25 = local_1a8->resize_type;
    local_180 = pIVar21;
    if (iVar25 == 2) {
      lVar44 = (long)(int)local_18c;
      iVar25 = local_18c * 3 + local_1ac * 3;
      uVar27 = 0xffffffffffffffff;
      if (-1 < iVar25) {
        uVar27 = (long)iVar25 * 4;
      }
      piVar20 = (int *)operator_new__(uVar27);
      piVar22 = piVar20 + lVar44;
      lVar46 = (long)(int)uVar24;
      pfVar31 = (float *)(piVar22 + lVar46);
      iVar25 = pIVar42->align_corner;
      linear_coeffs(uVar6,outw_01,piVar20,pfVar31,iVar25);
      local_1a0 = piVar22;
      local_170 = pfVar31 + lVar44 * 2;
      linear_coeffs(uVar19,uVar24,piVar22,pfVar31 + lVar44 * 2,iVar25);
      if (0 < (int)local_180) {
        pIVar21 = (Interp *)0x0;
        do {
          iVar25 = pMVar8->w;
          sVar9 = pMVar8->elemsize;
          lVar47 = pMVar8->cstep * (long)pIVar21 * sVar9;
          pvVar30 = pMVar8->data;
          uVar49 = this_00->w;
          uVar7 = this_00->h;
          pvVar50 = this_00->data;
          local_178 = (int *)this_00->elemsize;
          local_198 = this_00->cstep;
          local_168.cstep = 0;
          local_168.data = (void *)0x0;
          local_168.refcount._0_4_ = 0;
          local_168.refcount._4_4_ = 0;
          local_168.elemsize._0_4_ = 0;
          local_168._20_8_ = 0;
          local_168.h = 0;
          local_168.d = 0;
          local_168.c = 0;
          local_168.allocator = (Allocator *)0x0;
          local_168.dims = 0;
          local_168.w = 0;
          local_188 = pIVar21;
          Mat::create(&local_168,uVar49,4,(Allocator *)0x0);
          local_118.cstep = 0;
          local_118.data = (void *)0x0;
          local_118.refcount._0_4_ = 0;
          local_118.refcount._4_4_ = 0;
          local_118.elemsize._0_4_ = 0;
          local_118._20_8_ = 0;
          local_118.h = 0;
          local_118.d = 0;
          local_118.c = 0;
          local_118.allocator = (Allocator *)0x0;
          local_118.dims = 0;
          local_118.w = 0;
          Mat::create(&local_118,uVar49,4,(Allocator *)0x0);
          if (0 < (int)uVar7) {
            lVar26 = sVar9 * (long)iVar25;
            pvVar50 = (void *)((long)pvVar50 + local_198 * (long)local_178 * (long)local_188);
            uVar27 = 0;
            pfVar31 = local_170;
            pvVar36 = local_168.data;
            pvVar41 = local_118.data;
            iVar25 = -2;
            do {
              iVar18 = local_1a0[uVar27];
              pvVar35 = pvVar36;
              pvVar23 = pvVar41;
              if (iVar18 == iVar25) {
LAB_0041a1ad:
                if (0 < (int)uVar49) {
                  fVar51 = *pfVar31;
                  fVar53 = pfVar31[1];
                  lVar40 = 0;
                  do {
                    *(float *)((long)pvVar50 + lVar40 * 4) =
                         *(float *)((long)pvVar23 + lVar40 * 4) * fVar53 +
                         *(float *)((long)pvVar35 + lVar40 * 4) * fVar51;
                    lVar40 = lVar40 + 1;
                  } while (uVar49 != (uint)lVar40);
                }
              }
              else if (iVar18 == iVar25 + 1) {
                pvVar23 = pvVar36;
                pvVar35 = pvVar41;
                if (0 < (int)uVar49) {
                  uVar32 = 0;
                  do {
                    uVar5 = *(undefined8 *)
                             ((long)pvVar30 +
                             (long)piVar20[uVar32] * 4 + ((long)iVar18 + 1) * lVar26 + lVar47);
                    *(float *)((long)pvVar36 + uVar32 * 4) =
                         (float)((ulong)uVar5 >> 0x20) *
                         (float)((ulong)*(undefined8 *)(piVar20 + lVar46 + lVar44 + uVar32 * 2) >>
                                0x20) +
                         (float)uVar5 *
                         (float)*(undefined8 *)(piVar20 + lVar46 + lVar44 + uVar32 * 2);
                    uVar32 = uVar32 + 1;
                  } while (uVar49 != uVar32);
                  goto LAB_0041a1ad;
                }
              }
              else if (0 < (int)uVar49) {
                uVar32 = 0;
                do {
                  iVar25 = piVar20[uVar32];
                  uVar5 = *(undefined8 *)
                           ((long)pvVar30 + (long)iVar25 * 4 + iVar18 * lVar26 + lVar47);
                  fVar51 = (float)*(undefined8 *)(piVar20 + lVar46 + lVar44 + uVar32 * 2);
                  fVar53 = (float)((ulong)*(undefined8 *)(piVar20 + lVar46 + lVar44 + uVar32 * 2) >>
                                  0x20);
                  *(float *)((long)pvVar36 + uVar32 * 4) =
                       (float)((ulong)uVar5 >> 0x20) * fVar53 + (float)uVar5 * fVar51;
                  uVar5 = *(undefined8 *)
                           ((long)pvVar30 + (long)iVar25 * 4 + (iVar18 + 1) * lVar26 + lVar47);
                  *(float *)((long)pvVar41 + uVar32 * 4) =
                       (float)((ulong)uVar5 >> 0x20) * fVar53 + (float)uVar5 * fVar51;
                  uVar32 = uVar32 + 1;
                } while (uVar49 != uVar32);
                goto LAB_0041a1ad;
              }
              pvVar36 = pvVar35;
              pfVar31 = pfVar31 + 2;
              uVar27 = uVar27 + 1;
              pvVar50 = (void *)((long)pvVar50 + (long)(int)uVar49 * (long)local_178);
              pvVar41 = pvVar23;
              iVar25 = iVar18;
              local_198 = (ulong)uVar7;
            } while (uVar27 != uVar7);
          }
          piVar22 = (int *)CONCAT44(local_118.refcount._4_4_,local_118.refcount._0_4_);
          if (piVar22 != (int *)0x0) {
            LOCK();
            *piVar22 = *piVar22 + -1;
            UNLOCK();
            if (*piVar22 == 0) {
              if (local_118.allocator == (Allocator *)0x0) {
                if (local_118.data != (void *)0x0) {
                  free(local_118.data);
                }
              }
              else {
                (*(local_118.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          piVar22 = (int *)CONCAT44(local_168.refcount._4_4_,local_168.refcount._0_4_);
          if (piVar22 != (int *)0x0) {
            LOCK();
            *piVar22 = *piVar22 + -1;
            UNLOCK();
            if (*piVar22 == 0) {
              if (local_168.allocator == (Allocator *)0x0) {
                if (local_168.data != (void *)0x0) {
                  free(local_168.data);
                }
              }
              else {
                (*(local_168.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          pIVar21 = (Interp *)((long)&(local_188->super_Layer)._vptr_Layer + 1);
        } while (pIVar21 != local_180);
      }
      operator_delete__(piVar20);
      iVar25 = local_1a8->resize_type;
    }
    else if (iVar25 == 1) {
      sVar10 = (local_1a8->size_expr)._M_string_length;
      if (local_1a8->output_height == 0 && sVar10 == 0) {
        fVar51 = 1.0 / local_1a8->height_scale;
      }
      else {
        fVar51 = (float)(int)uVar19 / (float)(int)uVar7;
      }
      if (local_1a8->output_width == 0 && sVar10 == 0) {
        fVar53 = 1.0 / local_1a8->width_scale;
      }
      else {
        fVar53 = (float)(int)uVar6 / (float)(int)outw_00;
      }
      if ((int)uVar49 < 1) {
        return 0;
      }
      local_198 = CONCAT44(local_198._4_4_,1);
      sVar28 = pMVar8->cstep;
      sVar11 = pMVar8->elemsize;
      sVar12 = this_00->elemsize;
      pvVar50 = pMVar8->data;
      pIVar42 = (Interp *)0x0;
      do {
        if (0 < (int)uVar7) {
          puVar29 = (undefined4 *)(sVar9 * sVar12 * (long)pIVar42 + (long)pvVar30);
          uVar49 = 0;
          do {
            if (0 < (int)outw_00) {
              iVar18 = (int)((float)(int)uVar49 * fVar51);
              if ((int)(uVar19 - 1) < (int)((float)(int)uVar49 * fVar51)) {
                iVar18 = uVar19 - 1;
              }
              uVar24 = 0;
              do {
                iVar38 = uVar6 - 1;
                if ((int)((float)(int)uVar24 * fVar53) <= (int)(uVar6 - 1)) {
                  iVar38 = (int)((float)(int)uVar24 * fVar53);
                }
                *puVar29 = *(undefined4 *)
                            ((long)pvVar50 +
                            (long)(int)(iVar38 + iVar18 * uVar6) * 4 +
                            sVar28 * sVar11 * (long)pIVar42);
                puVar29 = puVar29 + 1;
                uVar24 = uVar24 + 1;
              } while (outw_00 != uVar24);
            }
            uVar49 = uVar49 + 1;
          } while (uVar49 != uVar7);
        }
        pIVar42 = (Interp *)((long)&(pIVar42->super_Layer)._vptr_Layer + 1);
      } while (pIVar42 != pIVar21);
    }
    uVar7 = local_18c;
    pIVar21 = local_1a8;
    uVar49 = local_1ac;
    if (iVar25 != 3) {
      return 0;
    }
    lVar44 = (long)(int)local_18c;
    iVar25 = local_18c * 5 + local_1ac * 5;
    uVar27 = 0xffffffffffffffff;
    if (-1 < iVar25) {
      uVar27 = (long)iVar25 * 4;
    }
    piVar22 = (int *)operator_new__(uVar27);
    piVar20 = piVar22 + lVar44;
    lVar46 = (long)(int)uVar49;
    pfVar31 = (float *)(piVar20 + lVar46);
    cubic_coeffs(uVar6,uVar7,piVar22,pfVar31,pIVar21->align_corner);
    local_178 = piVar20;
    local_170 = pfVar31 + lVar44 * 4;
    cubic_coeffs(uVar19,uVar49,piVar20,pfVar31 + lVar44 * 4,pIVar21->align_corner);
    if (0 < (int)local_180) {
      pIVar21 = (Interp *)0x0;
      do {
        iVar25 = pMVar8->w;
        local_1a0 = (int *)pMVar8->elemsize;
        local_188 = (Interp *)(pMVar8->cstep * (long)pIVar21 * (long)local_1a0 + (long)pMVar8->data)
        ;
        uVar6 = this_00->w;
        local_198 = (size_t)(uint)this_00->h;
        pvVar30 = this_00->data;
        sVar9 = this_00->elemsize;
        sVar28 = this_00->cstep;
        local_168.cstep = 0;
        local_168.data = (void *)0x0;
        local_168.refcount._0_4_ = 0;
        local_168.refcount._4_4_ = 0;
        local_168.elemsize._0_4_ = 0;
        local_168._20_8_ = 0;
        local_168.h = 0;
        local_168.d = 0;
        local_168.c = 0;
        local_168.allocator = (Allocator *)0x0;
        local_168.dims = 0;
        local_168.w = 0;
        local_1a8 = pIVar21;
        Mat::create(&local_168,uVar6,4,(Allocator *)0x0);
        local_118.cstep = 0;
        local_118.data = (void *)0x0;
        local_118.refcount._0_4_ = 0;
        local_118.refcount._4_4_ = 0;
        local_118.elemsize._0_4_ = 0;
        local_118._20_8_ = 0;
        local_118.h = 0;
        local_118.d = 0;
        local_118.c = 0;
        local_118.allocator = (Allocator *)0x0;
        local_118.dims = 0;
        local_118.w = 0;
        Mat::create(&local_118,uVar6,4,(Allocator *)0x0);
        local_c8.cstep = 0;
        local_c8.data = (void *)0x0;
        local_c8.refcount._0_4_ = 0;
        local_c8.refcount._4_4_ = 0;
        local_c8.elemsize._0_4_ = 0;
        local_c8._20_8_ = 0;
        local_c8.h = 0;
        local_c8.d = 0;
        local_c8.c = 0;
        local_c8.allocator = (Allocator *)0x0;
        local_c8.dims = 0;
        local_c8.w = 0;
        Mat::create(&local_c8,uVar6,4,(Allocator *)0x0);
        piVar20 = local_178;
        local_78.cstep = 0;
        local_78.data = (void *)0x0;
        local_78.refcount._0_4_ = 0;
        local_78.refcount._4_4_ = 0;
        local_78.elemsize._0_4_ = 0;
        local_78._20_8_ = 0;
        local_78.h = 0;
        local_78.d = 0;
        local_78.c = 0;
        local_78.allocator = (Allocator *)0x0;
        local_78.dims = 0;
        local_78.w = 0;
        Mat::create(&local_78,uVar6,4,(Allocator *)0x0);
        pIVar42 = local_180;
        if (0 < (int)local_198) {
          local_1a0 = (int *)((long)local_1a0 * (long)iVar25);
          local_188 = (Interp *)((long)&local_188[-1].size_expr.field_2 + 0xc);
          lVar47 = (ulong)uVar6 * 4;
          pvVar30 = (void *)((long)pvVar30 + sVar28 * sVar9 * (long)local_1a8);
          sVar28 = 0;
          pfVar31 = local_170;
          pvVar50 = local_78.data;
          pvVar36 = local_168.data;
          pvVar41 = local_118.data;
          pvVar35 = local_c8.data;
          iVar25 = -3;
          do {
            iVar18 = piVar20[sVar28];
            pvVar33 = pvVar50;
            pvVar23 = pvVar36;
            pvVar43 = pvVar41;
            pvVar45 = pvVar35;
            if (iVar18 == iVar25) {
LAB_0041a891:
              if (0 < (int)uVar6) {
                fVar51 = *pfVar31;
                fVar53 = pfVar31[1];
                fVar13 = pfVar31[2];
                fVar14 = pfVar31[3];
                lVar26 = 0;
                do {
                  *(float *)((long)pvVar30 + lVar26 * 4) =
                       *(float *)((long)pvVar33 + lVar26 * 4) * fVar14 +
                       *(float *)((long)pvVar43 + lVar26 * 4) * fVar53 +
                       *(float *)((long)pvVar45 + lVar26 * 4) * fVar13 +
                       *(float *)((long)pvVar23 + lVar26 * 4) * fVar51;
                  lVar26 = lVar26 + 1;
                } while (uVar6 != (uint)lVar26);
              }
            }
            else {
              lVar26 = (long)iVar18;
              if (iVar18 == iVar25 + 1) {
                pvVar23 = pvVar41;
                pvVar33 = pvVar36;
                pvVar43 = pvVar35;
                pvVar45 = pvVar50;
                if (0 < (int)uVar6) {
                  lVar40 = 0;
                  do {
                    pfVar2 = (float *)(piVar22 + lVar46 + lVar44 + lVar40);
                    pfVar1 = (float *)((long)&(local_188->super_Layer)._vptr_Layer +
                                      (long)*(int *)((long)piVar22 + lVar40) * 4 +
                                      (lVar26 + 2) * (long)local_1a0);
                    *(float *)((long)pvVar36 + lVar40) =
                         pfVar1[3] * pfVar2[3] + pfVar1[1] * pfVar2[1] +
                         pfVar1[2] * pfVar2[2] + *pfVar1 * *pfVar2;
                    lVar40 = lVar40 + 4;
                  } while (lVar47 - lVar40 != 0);
                  goto LAB_0041a891;
                }
              }
              else if (iVar18 == iVar25 + 2) {
                pvVar23 = pvVar35;
                pvVar33 = pvVar41;
                pvVar43 = pvVar50;
                pvVar45 = pvVar36;
                if (0 < (int)uVar6) {
                  lVar40 = 0;
                  do {
                    iVar25 = *(int *)((long)piVar22 + lVar40);
                    pfVar2 = (float *)(piVar22 + lVar46 + lVar44 + lVar40);
                    fVar51 = *pfVar2;
                    fVar53 = pfVar2[1];
                    fVar13 = pfVar2[2];
                    fVar14 = pfVar2[3];
                    pfVar2 = (float *)((long)&(local_188->super_Layer)._vptr_Layer +
                                      (long)iVar25 * 4 + (lVar26 + 1) * (long)local_1a0);
                    *(float *)((long)pvVar36 + lVar40) =
                         pfVar2[3] * fVar14 + pfVar2[1] * fVar53 +
                         pfVar2[2] * fVar13 + *pfVar2 * fVar51;
                    pfVar2 = (float *)((long)&(local_188->super_Layer)._vptr_Layer +
                                      (long)iVar25 * 4 + (long)(iVar18 + 2) * (long)local_1a0);
                    *(float *)((long)pvVar41 + lVar40) =
                         pfVar2[3] * fVar14 + pfVar2[1] * fVar53 +
                         pfVar2[2] * fVar13 + *pfVar2 * fVar51;
                    lVar40 = lVar40 + 4;
                  } while (lVar47 - lVar40 != 0);
                  goto LAB_0041a891;
                }
              }
              else {
                piVar20 = local_178;
                if (iVar18 == iVar25 + 3) {
                  pvVar23 = pvVar50;
                  pvVar33 = pvVar35;
                  pvVar43 = pvVar36;
                  pvVar45 = pvVar41;
                  if (0 < (int)uVar6) {
                    lVar40 = 0;
                    do {
                      lVar48 = (long)*(int *)((long)piVar22 + lVar40);
                      pfVar2 = (float *)(piVar22 + lVar46 + lVar44 + lVar40);
                      fVar51 = *pfVar2;
                      fVar53 = pfVar2[1];
                      fVar13 = pfVar2[2];
                      fVar14 = pfVar2[3];
                      pfVar2 = (float *)((long)&(local_188->super_Layer)._vptr_Layer +
                                        lVar48 * 4 + lVar26 * (long)local_1a0);
                      *(float *)((long)pvVar36 + lVar40) =
                           pfVar2[3] * fVar14 + pfVar2[1] * fVar53 +
                           pfVar2[2] * fVar13 + *pfVar2 * fVar51;
                      pfVar2 = (float *)((long)&(local_188->super_Layer)._vptr_Layer +
                                        lVar48 * 4 + (long)(iVar18 + 1) * (long)local_1a0);
                      *(float *)((long)pvVar41 + lVar40) =
                           pfVar2[3] * fVar14 + pfVar2[1] * fVar53 +
                           pfVar2[2] * fVar13 + *pfVar2 * fVar51;
                      pfVar2 = (float *)((long)&(local_188->super_Layer)._vptr_Layer +
                                        lVar48 * 4 + (long)(iVar18 + 2) * (long)local_1a0);
                      *(float *)((long)pvVar35 + lVar40) =
                           pfVar2[3] * fVar14 + pfVar2[1] * fVar53 +
                           pfVar2[2] * fVar13 + *pfVar2 * fVar51;
                      lVar40 = lVar40 + 4;
                    } while (lVar47 - lVar40 != 0);
                    goto LAB_0041a891;
                  }
                }
                else if (0 < (int)uVar6) {
                  lVar40 = 0;
                  do {
                    lVar48 = (long)*(int *)((long)piVar22 + lVar40);
                    pfVar2 = (float *)(piVar22 + lVar46 + lVar44 + lVar40);
                    fVar51 = *pfVar2;
                    fVar53 = pfVar2[1];
                    fVar13 = pfVar2[2];
                    fVar14 = pfVar2[3];
                    pfVar2 = (float *)((long)&(local_188->super_Layer)._vptr_Layer +
                                      lVar48 * 4 + (lVar26 + -1) * (long)local_1a0);
                    *(float *)((long)pvVar36 + lVar40) =
                         pfVar2[3] * fVar14 + pfVar2[1] * fVar53 +
                         pfVar2[2] * fVar13 + *pfVar2 * fVar51;
                    pfVar2 = (float *)((long)&(local_188->super_Layer)._vptr_Layer +
                                      lVar48 * 4 + lVar26 * (long)local_1a0);
                    *(float *)((long)pvVar41 + lVar40) =
                         pfVar2[3] * fVar14 + pfVar2[1] * fVar53 +
                         pfVar2[2] * fVar13 + *pfVar2 * fVar51;
                    pfVar2 = (float *)((long)&(local_188->super_Layer)._vptr_Layer +
                                      lVar48 * 4 + (long)(iVar18 + 1) * (long)local_1a0);
                    *(float *)((long)pvVar35 + lVar40) =
                         pfVar2[3] * fVar14 + pfVar2[1] * fVar53 +
                         pfVar2[2] * fVar13 + *pfVar2 * fVar51;
                    pfVar2 = (float *)((long)&(local_188->super_Layer)._vptr_Layer +
                                      lVar48 * 4 + (long)(iVar18 + 2) * (long)local_1a0);
                    *(float *)((long)pvVar50 + lVar40) =
                         pfVar2[3] * fVar14 + pfVar2[1] * fVar53 +
                         pfVar2[2] * fVar13 + *pfVar2 * fVar51;
                    lVar40 = lVar40 + 4;
                  } while (lVar47 - lVar40 != 0);
                  goto LAB_0041a891;
                }
              }
            }
            pvVar35 = pvVar45;
            pvVar41 = pvVar43;
            pfVar31 = pfVar31 + 4;
            sVar28 = sVar28 + 1;
            pvVar30 = (void *)((long)pvVar30 + (long)(int)uVar6 * sVar9);
            pvVar50 = pvVar33;
            pvVar36 = pvVar23;
            iVar25 = iVar18;
          } while (sVar28 != local_198);
        }
        piVar20 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
        if (piVar20 != (int *)0x0) {
          LOCK();
          *piVar20 = *piVar20 + -1;
          UNLOCK();
          if (*piVar20 == 0) {
            if (local_78.allocator == (Allocator *)0x0) {
              if (local_78.data != (void *)0x0) {
                free(local_78.data);
              }
            }
            else {
              (*(local_78.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        piVar20 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
        if (piVar20 != (int *)0x0) {
          LOCK();
          *piVar20 = *piVar20 + -1;
          UNLOCK();
          if (*piVar20 == 0) {
            if (local_c8.allocator == (Allocator *)0x0) {
              if (local_c8.data != (void *)0x0) {
                free(local_c8.data);
              }
            }
            else {
              (*(local_c8.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        piVar20 = (int *)CONCAT44(local_118.refcount._4_4_,local_118.refcount._0_4_);
        if (piVar20 != (int *)0x0) {
          LOCK();
          *piVar20 = *piVar20 + -1;
          UNLOCK();
          if (*piVar20 == 0) {
            if (local_118.allocator == (Allocator *)0x0) {
              if (local_118.data != (void *)0x0) {
                free(local_118.data);
              }
            }
            else {
              (*(local_118.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        piVar20 = (int *)CONCAT44(local_168.refcount._4_4_,local_168.refcount._0_4_);
        if (piVar20 != (int *)0x0) {
          LOCK();
          *piVar20 = *piVar20 + -1;
          UNLOCK();
          if (*piVar20 == 0) {
            if (local_168.allocator == (Allocator *)0x0) {
              if (local_168.data != (void *)0x0) {
                free(local_168.data);
              }
            }
            else {
              (*(local_168.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        pIVar21 = (Interp *)((long)&(local_1a8->super_Layer)._vptr_Layer + 1);
      } while (pIVar21 != pIVar42);
    }
  }
  operator_delete__(piVar22);
  return 0;
}

Assistant:

int Interp::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    const Mat& reference_blob = bottom_blobs[1];
    Mat& top_blob = top_blobs[0];

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;

    int outw = reference_blob.w;
    int outh = reference_blob.h;

    if (!size_expr.empty())
    {
        int r = eval_size_expr(bottom_blobs, outw, outh);
        if (r != 0)
            return -1;
    }

    if (dims == 1)
    {
        // special case for 2d resize on flattened blob
        top_blob.create(outw, outh, w, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < w; q++)
        {
            Mat top_blob_c = top_blob.channel(q);
            const float v = bottom_blob[q];
            top_blob_c.fill(v);
        }

        return 0;
    }

    if (dims == 2)
    {
        if (outw == w)
        {
            top_blob = bottom_blob;
            return 0;
        }

        top_blob.create(outw, h, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (resize_type == 1) // nearest
        {
            const float ws = (output_width || !size_expr.empty()) ? w / (float)outw : 1.f / width_scale;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int y = 0; y < h; y++)
            {
                const float* ptr = bottom_blob.row(y);
                float* outptr = top_blob.row(y);
                for (int x = 0; x < outw; x++)
                {
                    int in_x = std::min((int)(x * ws), (w - 1));
                    *outptr++ = ptr[in_x];
                }
            }
        }

        if (resize_type == 2) // bilinear
        {
            int* buf = new int[outw + outw * 2];

            int* xofs = buf;
            float* alpha = (float*)(buf + outw);

            linear_coeffs(w, outw, xofs, alpha, align_corner);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int y = 0; y < h; y++)
            {
                const float* ptr = bottom_blob.row(y);
                float* outptr = top_blob.row(y);
                const float* alphap = alpha;

                for (int x = 0; x < outw; x++)
                {
                    int sx = xofs[x];
                    const float* Sp = ptr + sx;
                    float a0 = alphap[0];
                    float a1 = alphap[1];
                    *outptr++ = Sp[0] * a0 + Sp[1] * a1;
                    alphap += 2;
                }
            }

            delete[] buf;
        }

        if (resize_type == 3) // bicubic
        {
            int* buf = new int[outw + outw * 4];

            int* xofs = buf;
            float* alpha = (float*)(buf + outw);

            cubic_coeffs(w, outw, xofs, alpha, align_corner);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int y = 0; y < h; y++)
            {
                const float* ptr = bottom_blob.row(y);
                float* outptr = top_blob.row(y);
                const float* alphap = alpha;

                for (int x = 0; x < outw; x++)
                {
                    int sx = xofs[x];
                    const float* Sp = ptr + sx;
                    float a0 = alphap[0];
                    float a1 = alphap[1];
                    float a2 = alphap[2];
                    float a3 = alphap[3];
                    *outptr++ = Sp[-1] * a0 + Sp[0] * a1 + Sp[1] * a2 + Sp[2] * a3;
                    alphap += 4;
                }
            }

            delete[] buf;
        }

        return 0;
    }

    if (outw == w && outh == h)
    {
        top_blob = bottom_blob;
        return 0;
    }

    top_blob.create(outw, outh, channels, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    if (resize_type == 1) // nearest
    {
        const float hs = (output_height || !size_expr.empty()) ? h / (float)outh : 1.f / height_scale;
        const float ws = (output_width || !size_expr.empty()) ? w / (float)outw : 1.f / width_scale;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);
            for (int y = 0; y < outh; y++)
            {
                int in_y = std::min((int)(y * hs), (h - 1));
                for (int x = 0; x < outw; x++)
                {
                    int in_x = std::min((int)(x * ws), (w - 1));
                    *outptr++ = ptr[in_y * w + in_x];
                }
            }
        }
    }

    if (resize_type == 2) // bilinear
    {
        int* buf = new int[outw + outh + outw * 2 + outh * 2];

        int* xofs = buf;        //new int[outw];
        int* yofs = buf + outw; //new int[outh];

        float* alpha = (float*)(buf + outw + outh);           //new float[outw * 2];
        float* beta = (float*)(buf + outw + outh + outw * 2); //new float[outh * 2];

        linear_coeffs(w, outw, xofs, alpha, align_corner);
        linear_coeffs(h, outh, yofs, beta, align_corner);

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; ++q)
        {
            const Mat src = bottom_blob.channel(q);
            Mat dst = top_blob.channel(q);

            resize_bilinear_image(src, dst, alpha, xofs, beta, yofs);
        }

        delete[] buf;
    }

    if (resize_type == 3) // bicubic
    {
        int* buf = new int[outw + outh + outw * 4 + outh * 4];

        int* xofs = buf;        //new int[outw];
        int* yofs = buf + outw; //new int[outh];

        float* alpha = (float*)(buf + outw + outh);           //new float[outw * 4];
        float* beta = (float*)(buf + outw + outh + outw * 4); //new float[outh * 4];

        cubic_coeffs(w, outw, xofs, alpha, align_corner);
        cubic_coeffs(h, outh, yofs, beta, align_corner);

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const Mat src = bottom_blob.channel(q);
            Mat dst = top_blob.channel(q);

            resize_bicubic_image(src, dst, alpha, xofs, beta, yofs);
        }

        delete[] buf;
    }

    return 0;
}